

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

bool wallet::RemoveWalletSetting(Chain *chain,string *wallet_name)

{
  undefined1 uVar1;
  long in_FS_OFFSET;
  string *local_68;
  undefined8 uStack_60;
  code *local_58;
  code *pcStack_50;
  long *local_48 [2];
  long local_38 [2];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"wallet","");
  uStack_60 = 0;
  pcStack_50 = std::
               _Function_handler<std::optional<interfaces::SettingsAction>_(UniValue_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp:109:34)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<std::optional<interfaces::SettingsAction>_(UniValue_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp:109:34)>
             ::_M_manager;
  local_68 = wallet_name;
  uVar1 = (**(code **)(*(long *)chain + 0x188))(chain,(string *)local_48);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,3);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (bool)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool RemoveWalletSetting(interfaces::Chain& chain, const std::string& wallet_name)
{
    const auto update_function = [&wallet_name](common::SettingsValue& setting_value) {
        if (!setting_value.isArray()) return interfaces::SettingsAction::SKIP_WRITE;
        common::SettingsValue new_value(common::SettingsValue::VARR);
        for (const auto& value : setting_value.getValues()) {
            if (!value.isStr() || value.get_str() != wallet_name) new_value.push_back(value);
        }
        if (new_value.size() == setting_value.size()) return interfaces::SettingsAction::SKIP_WRITE;
        setting_value = std::move(new_value);
        return interfaces::SettingsAction::WRITE;
    };
    return chain.updateRwSetting("wallet", update_function);
}